

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

void free_miniscript_node(miniscript_node_t *node)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *node_00;
  
  if (node == (miniscript_node_t *)0x0) {
    return;
  }
  node_00 = node->child;
  while (node_00 != (miniscript_node_t *)0x0) {
    pmVar1 = node_00->next;
    free_miniscript_node(node_00);
    node_00 = pmVar1;
  }
  if ((node->data != (char *)0x0) && ((ulong)node->data_size != 0)) {
    wally_bzero(node->data,(ulong)node->data_size);
    wally_free(node->data);
  }
  if ((node->derive_path != (char *)0x0) && ((ulong)node->derive_path_len != 0)) {
    wally_bzero(node->derive_path,(ulong)node->derive_path_len);
    wally_free(node->derive_path);
  }
  if ((node->key_origin_info != (char *)0x0) && ((ulong)node->key_origin_info_len != 0)) {
    wally_bzero(node->key_origin_info,(ulong)node->key_origin_info_len);
    wally_free(node->key_origin_info);
  }
  wally_bzero(node,0x80);
  wally_free(node);
  return;
}

Assistant:

static void free_miniscript_node(struct miniscript_node_t *node)
{
    if (!node)
        return;
    if (node->child) {
        struct miniscript_node_t *child = node->child;
        struct miniscript_node_t *next;
        while (child) {
            next = child->next;
            free_miniscript_node(child);
            child = next;
        }
    }

    if (node->data && node->data_size) {
        wally_bzero(node->data, node->data_size);
        wally_free(node->data);
    }
    if (node->derive_path && node->derive_path_len) {
        wally_bzero(node->derive_path, node->derive_path_len);
        wally_free(node->derive_path);
    }
    if (node->key_origin_info && node->key_origin_info_len) {
        wally_bzero(node->key_origin_info, node->key_origin_info_len);
        wally_free(node->key_origin_info);
    }

    wally_bzero(node, sizeof(struct miniscript_node_t));
    wally_free(node);
}